

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O0

TScreen * ImTui_ImplNcurses_Init(bool mouseSupport,float fps_active,float fps_idle)

{
  int iVar1;
  int iVar2;
  TScreen *this;
  float *pfVar3;
  ImGuiIO *pIVar4;
  byte in_DIL;
  float in_XMM0_Da;
  float in_XMM1_Da;
  int screenSizeY;
  int screenSizeX;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  TScreen *in_stack_ffffffffffffffb8;
  ImVec2 in_stack_ffffffffffffffc0;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  float local_c;
  float local_8;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_c = in_XMM1_Da;
  local_8 = in_XMM0_Da;
  if (g_screen == (TScreen *)0x0) {
    this = (TScreen *)operator_new(0x18);
    memset(this,0,0x18);
    ImTui::TScreen::TScreen(this);
    g_screen = this;
    in_stack_ffffffffffffffb8 = g_screen;
  }
  if (local_c < 0.0) {
    local_c = local_8;
  }
  pfVar3 = std::min<float>(&local_8,&local_c);
  local_c = *pfVar3;
  anon_unknown.dwarf_31576::VSync::VSync
            ((VSync *)in_stack_ffffffffffffffc0,(double)in_stack_ffffffffffffffb8,
             (double)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  g_vsync.tStepActive_us = local_30;
  g_vsync.tStepIdle_us = local_28;
  g_vsync.tLast_us = local_20;
  g_vsync.tNext_us = local_18;
  initscr();
  use_default_colors();
  start_color();
  cbreak();
  noecho();
  curs_set(0);
  nodelay(_stdscr,1);
  wtimeout(_stdscr,1);
  set_escdelay(0x19);
  keypad(_stdscr,1);
  if ((local_1 & 1) != 0) {
    mouseinterval(0);
    mousemask(0x1fffffff,0);
    printf("\x1b[?1003h\n");
  }
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0] = 9;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[1] = 0x104;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[2] = 0x105;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[3] = 0x103;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[4] = 0x102;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[5] = 0x153;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[6] = 0x152;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[7] = 0x106;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[8] = 0x168;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[9] = 0x14b;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[10] = 0x14a;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0xb] = 0x107;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0xc] = 0x20;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0xd] = 10;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0xe] = 0x1b;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0xf] = 0x157;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0x10] = 1;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0x11] = 3;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0x12] = 0x16;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0x13] = 0x18;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0x14] = 0x19;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyMap[0x15] = 0x1a;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyRepeatDelay = 0.05;
  pIVar4 = ImGui::GetIO();
  pIVar4->KeyRepeatRate = 0.05;
  if (_stdscr == 0) {
    iVar1 = -1;
    iVar2 = -1;
  }
  else {
    iVar1 = *(short *)(_stdscr + 4) + 1;
    iVar2 = *(short *)(_stdscr + 6) + 1;
  }
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,(float)iVar2,(float)iVar1);
  pIVar4 = ImGui::GetIO();
  pIVar4->DisplaySize = in_stack_ffffffffffffffc0;
  return g_screen;
}

Assistant:

ImTui::TScreen * ImTui_ImplNcurses_Init(bool mouseSupport, float fps_active, float fps_idle) {
    if (g_screen == nullptr) {
        g_screen = new ImTui::TScreen();
    }

    if (fps_idle < 0.0) {
        fps_idle = fps_active;
    }
    fps_idle = std::min(fps_active, fps_idle);
    g_vsync = VSync(fps_active, fps_idle);

    initscr();
    use_default_colors();
    start_color();
    cbreak();
    noecho();
    curs_set(0);
    nodelay(stdscr, TRUE);
    wtimeout(stdscr, 1);
    set_escdelay(25);
    keypad(stdscr, true);

    if (mouseSupport) {
        mouseinterval(0);
        mousemask(ALL_MOUSE_EVENTS | REPORT_MOUSE_POSITION, NULL);
        printf("\033[?1003h\n");
    }

    ImGui::GetIO().KeyMap[ImGuiKey_Tab]         = 9;
    ImGui::GetIO().KeyMap[ImGuiKey_LeftArrow]   = 260;
    ImGui::GetIO().KeyMap[ImGuiKey_RightArrow]  = 261;
    ImGui::GetIO().KeyMap[ImGuiKey_UpArrow]     = 259;
    ImGui::GetIO().KeyMap[ImGuiKey_DownArrow]   = 258;
    ImGui::GetIO().KeyMap[ImGuiKey_PageUp]      = 339;
    ImGui::GetIO().KeyMap[ImGuiKey_PageDown]    = 338;
    ImGui::GetIO().KeyMap[ImGuiKey_Home]        = 262;
    ImGui::GetIO().KeyMap[ImGuiKey_End]         = 360;
    ImGui::GetIO().KeyMap[ImGuiKey_Insert]      = 331;
    ImGui::GetIO().KeyMap[ImGuiKey_Delete]      = 330;
    ImGui::GetIO().KeyMap[ImGuiKey_Backspace]   = 263;
    ImGui::GetIO().KeyMap[ImGuiKey_Space]       = 32;
    ImGui::GetIO().KeyMap[ImGuiKey_Enter]       = 10;
    ImGui::GetIO().KeyMap[ImGuiKey_Escape]      = 27;
    ImGui::GetIO().KeyMap[ImGuiKey_KeyPadEnter] = 343;
    ImGui::GetIO().KeyMap[ImGuiKey_A]           = 1;
    ImGui::GetIO().KeyMap[ImGuiKey_C]           = 3;
    ImGui::GetIO().KeyMap[ImGuiKey_V]           = 22;
    ImGui::GetIO().KeyMap[ImGuiKey_X]           = 24;
    ImGui::GetIO().KeyMap[ImGuiKey_Y]           = 25;
    ImGui::GetIO().KeyMap[ImGuiKey_Z]           = 26;

    ImGui::GetIO().KeyRepeatDelay = 0.050;
    ImGui::GetIO().KeyRepeatRate = 0.050;

	int screenSizeX = 0;
	int screenSizeY = 0;

	getmaxyx(stdscr, screenSizeY, screenSizeX);
	ImGui::GetIO().DisplaySize = ImVec2(screenSizeX, screenSizeY);

    return g_screen;
}